

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O0

int aom_realloc_frame_buffer
              (YV12_BUFFER_CONFIG *ybf,int width,int height,int ss_x,int ss_y,int use_highbitdepth,
              int border,int byte_alignment,aom_codec_frame_buffer_t *fb,
              aom_get_frame_buffer_cb_fn_t cb,void *cb_priv,_Bool alloc_pyramid,
              int alloc_y_plane_only)

{
  uint ss_y_00;
  uint height_00;
  int alloc_y_plane_only_00;
  int byte_alignment_00;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  int in_stack_00000008;
  uint64_t in_stack_00000018;
  uint64_t in_stack_00000020;
  int in_stack_00000028;
  byte in_stack_00000030;
  int in_stack_00000038;
  int error;
  int uv_border_h;
  int uv_border_w;
  int uv_height;
  int uv_width;
  int aligned_height;
  int aligned_width;
  uint64_t uvplane_size;
  uint64_t yplane_size;
  int uv_stride;
  int y_stride;
  int in_stack_fffffffffffffeac;
  int *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  void *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff58;
  undefined8 uVar1;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 local_5c;
  byte local_55;
  int local_34;
  
  local_55 = in_stack_00000030 & 1;
  if (in_RDI == 0) {
    local_34 = 2;
  }
  else {
    local_5c = 0;
    local_60 = 0;
    local_68 = 0;
    uVar1 = 0;
    ss_y_00 = in_ESI + 7U & 0xfffffff8;
    height_00 = in_EDX + 7U & 0xfffffff8;
    alloc_y_plane_only_00 = (int)height_00 >> (in_R8B & 0x1f);
    byte_alignment_00 = in_stack_00000008 >> (in_R8B & 0x1f);
    local_34 = calc_stride_and_planesize
                         ((int)&local_68,(int)((ulong)&local_60 >> 0x20),(int)&local_60,
                          (int)((ulong)&local_5c >> 0x20),(int)&local_5c,in_stack_fffffffffffffeac,
                          alloc_y_plane_only_00,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                          (uint64_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          (uint64_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffef8);
    if (local_34 == 0) {
      local_34 = realloc_frame_buffer_aligned
                           ((YV12_BUFFER_CONFIG *)
                            CONCAT44(in_stack_fffffffffffffefc,(int)ss_y_00 >> (in_CL & 0x1f)),
                            in_stack_fffffffffffffef4,height_00,in_stack_fffffffffffffeec,ss_y_00,
                            (int)((ulong)uVar1 >> 0x20),in_stack_00000008 >> (in_CL & 0x1f),
                            byte_alignment_00,
                            (aom_codec_frame_buffer_t *)
                            CONCAT44(in_stack_ffffffffffffff24,(uint)(local_55 & 1)),
                            (aom_get_frame_buffer_cb_fn_t)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_00000038),
                            in_stack_ffffffffffffff30,in_stack_00000008,in_stack_00000018,
                            in_stack_00000020,in_stack_00000028,in_stack_ffffffffffffff58,
                            (int)local_68,(int)uVar1,in_stack_00000038,byte_alignment_00,
                            alloc_y_plane_only_00,SUB81((ulong)uVar1 >> 0x18,0),(int)uVar1);
    }
  }
  return local_34;
}

Assistant:

int aom_realloc_frame_buffer(YV12_BUFFER_CONFIG *ybf, int width, int height,
                             int ss_x, int ss_y, int use_highbitdepth,
                             int border, int byte_alignment,
                             aom_codec_frame_buffer_t *fb,
                             aom_get_frame_buffer_cb_fn_t cb, void *cb_priv,
                             bool alloc_pyramid, int alloc_y_plane_only) {
  if (ybf) {
    int y_stride = 0;
    int uv_stride = 0;
    uint64_t yplane_size = 0;
    uint64_t uvplane_size = 0;
    const int aligned_width = (width + 7) & ~7;
    const int aligned_height = (height + 7) & ~7;
    const int uv_width = aligned_width >> ss_x;
    const int uv_height = aligned_height >> ss_y;
    const int uv_border_w = border >> ss_x;
    const int uv_border_h = border >> ss_y;

    int error = calc_stride_and_planesize(
        ss_x, ss_y, aligned_width, aligned_height, border, byte_alignment,
        alloc_y_plane_only, &y_stride, &uv_stride, &yplane_size, &uvplane_size,
        uv_height);
    if (error) return error;
    return realloc_frame_buffer_aligned(
        ybf, width, height, ss_x, ss_y, use_highbitdepth, border,
        byte_alignment, fb, cb, cb_priv, y_stride, yplane_size, uvplane_size,
        aligned_width, aligned_height, uv_width, uv_height, uv_stride,
        uv_border_w, uv_border_h, alloc_pyramid, alloc_y_plane_only);
  }
  return AOM_CODEC_MEM_ERROR;
}